

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wputils.c
# Opt level: O0

uint32_t WavpackUnpackSamples(WavpackContext *wpc,int32_t *buffer,uint32_t samples)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  uint in_EDX;
  read_stream in_RSI;
  WavpackContext *in_RDI;
  int num_channels;
  uint32_t samples_to_unpack;
  uint32_t samples_unpacked;
  uint32_t bcount;
  WavpackStream *wps;
  undefined4 in_stack_00000020;
  uint local_2c;
  uint32_t uVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar4 = 0;
  iVar1 = (in_RDI->config).num_channels;
  do {
    if (in_EDX == 0) {
      return uVar4;
    }
    if ((((in_RDI->stream).wphdr.block_samples == 0) ||
        (((in_RDI->stream).wphdr.flags & 0x800) == 0)) ||
       ((in_RDI->stream).wphdr.block_index + (in_RDI->stream).wphdr.block_samples <=
        (in_RDI->stream).sample_index)) {
      uVar2 = read_next_header(in_RSI,(WavpackHeader *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
      if (uVar2 == 0xffffffff) {
        return uVar4;
      }
      if ((((in_RDI->stream).wphdr.block_samples == 0) ||
          ((in_RDI->stream).sample_index == (in_RDI->stream).wphdr.block_index)) &&
         (iVar3 = unpack_init((WavpackContext *)CONCAT44(uVar2,uVar4)), iVar3 == 0)) {
        return uVar4;
      }
    }
    if ((((in_RDI->stream).wphdr.block_samples != 0) &&
        (((in_RDI->stream).wphdr.flags & 0x800) != 0)) &&
       ((in_RDI->stream).sample_index <
        (in_RDI->stream).wphdr.block_index + (in_RDI->stream).wphdr.block_samples)) {
      if ((in_RDI->stream).sample_index < (in_RDI->stream).wphdr.block_index) {
        local_2c = (in_RDI->stream).wphdr.block_index - (in_RDI->stream).sample_index;
        if (in_EDX < local_2c) {
          local_2c = in_EDX;
        }
        (in_RDI->stream).sample_index = local_2c + (in_RDI->stream).sample_index;
        uVar4 = local_2c + uVar4;
        in_EDX = in_EDX - local_2c;
        iVar3 = iVar1;
        if (in_RDI->reduced_channels != 0) {
          iVar3 = in_RDI->reduced_channels;
        }
        local_2c = iVar3 * local_2c;
        while (local_2c != 0) {
          *(undefined4 *)in_RSI = 0;
          local_2c = local_2c + -1;
          in_RSI = in_RSI + 4;
        }
      }
      else {
        local_2c = ((in_RDI->stream).wphdr.block_index + (in_RDI->stream).wphdr.block_samples) -
                   (in_RDI->stream).sample_index;
        if (in_EDX < local_2c) {
          local_2c = in_EDX;
        }
        unpack_samples((WavpackContext *)buffer,(int32_t *)CONCAT44(samples,in_stack_00000020),
                       wps._4_4_);
        iVar3 = iVar1;
        if (in_RDI->reduced_channels != 0) {
          iVar3 = in_RDI->reduced_channels;
        }
        in_RSI = in_RSI + (ulong)(local_2c * iVar3) * 4;
        uVar4 = local_2c + uVar4;
        in_EDX = in_EDX - local_2c;
        if (((in_RDI->stream).sample_index ==
             (in_RDI->stream).wphdr.block_index + (in_RDI->stream).wphdr.block_samples) &&
           (iVar3 = check_crc_error(in_RDI), iVar3 != 0)) {
          in_RDI->crc_errors = in_RDI->crc_errors + 1;
        }
        if ((in_RDI->stream).sample_index == in_RDI->total_samples) {
          return uVar4;
        }
      }
    }
  } while( true );
}

Assistant:

uint32_t WavpackUnpackSamples (WavpackContext *wpc, int32_t *buffer, uint32_t samples)
{
    WavpackStream *wps = &wpc->stream;
    uint32_t bcount, samples_unpacked = 0, samples_to_unpack;
    int num_channels = wpc->config.num_channels;

    while (samples) {
        if (!wps->wphdr.block_samples || !(wps->wphdr.flags & INITIAL_BLOCK) ||
            wps->sample_index >= wps->wphdr.block_index + wps->wphdr.block_samples) {
                bcount = read_next_header (wpc->infile, &wps->wphdr);

                if (bcount == (uint32_t) -1)
                    break;

                if (!wps->wphdr.block_samples || wps->sample_index == wps->wphdr.block_index)
                    if (!unpack_init (wpc))
                        break;
        }

        if (!wps->wphdr.block_samples || !(wps->wphdr.flags & INITIAL_BLOCK) ||
            wps->sample_index >= wps->wphdr.block_index + wps->wphdr.block_samples)
                continue;

        if (wps->sample_index < wps->wphdr.block_index) {
            samples_to_unpack = wps->wphdr.block_index - wps->sample_index;

            if (samples_to_unpack > samples)
                samples_to_unpack = samples;

            wps->sample_index += samples_to_unpack;
            samples_unpacked += samples_to_unpack;
            samples -= samples_to_unpack;

            if (wpc->reduced_channels)
                samples_to_unpack *= wpc->reduced_channels;
            else
                samples_to_unpack *= num_channels;

            while (samples_to_unpack--)
                *buffer++ = 0;

            continue;
        }

        samples_to_unpack = wps->wphdr.block_index + wps->wphdr.block_samples - wps->sample_index;

        if (samples_to_unpack > samples)
            samples_to_unpack = samples;

        unpack_samples (wpc, buffer, samples_to_unpack);

        if (wpc->reduced_channels)
            buffer += samples_to_unpack * wpc->reduced_channels;
        else
            buffer += samples_to_unpack * num_channels;

        samples_unpacked += samples_to_unpack;
        samples -= samples_to_unpack;

        if (wps->sample_index == wps->wphdr.block_index + wps->wphdr.block_samples) {
            if (check_crc_error (wpc))
                wpc->crc_errors++;
        }

        if (wps->sample_index == wpc->total_samples)
            break;
    }

    return samples_unpacked;
}